

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::IsFieldDependent(FieldDescriptor *field)

{
  bool bVar1;
  bool bVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  long lVar5;
  long lVar6;
  
  if ((*(long *)(field + 0x60) != 0) &&
     (CVar3 = FieldDescriptor::cpp_type(field), CVar3 == CPPTYPE_STRING)) {
    return true;
  }
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    pDVar4 = FieldDescriptor::message_type(field);
    lVar6 = -1;
    lVar5 = 0;
    do {
      lVar6 = lVar6 + 1;
      bVar1 = lVar6 < *(int *)(pDVar4 + 0x2c);
      if (*(int *)(pDVar4 + 0x2c) <= lVar6) {
        return bVar1;
      }
      bVar2 = IsFieldDependent((FieldDescriptor *)(lVar5 + *(long *)(pDVar4 + 0x30)));
      lVar5 = lVar5 + 0xa8;
    } while (!bVar2);
  }
  else {
    CVar3 = FieldDescriptor::cpp_type(field);
    if (CVar3 == CPPTYPE_MESSAGE) {
      bVar1 = true;
      if (*(long *)(field + 0x60) == 0) {
        lVar6 = *(long *)(field + 0x30);
        pDVar4 = FieldDescriptor::message_type(field);
        bVar1 = lVar6 != *(long *)(pDVar4 + 0x10);
      }
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool IsFieldDependent(const FieldDescriptor* field) {
  if (field->containing_oneof() != NULL &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    return true;
  }
  if (field->is_map()) {
    const Descriptor* map_descriptor = field->message_type();
    for (int i = 0; i < map_descriptor->field_count(); i++) {
      if (IsFieldDependent(map_descriptor->field(i))) {
        return true;
      }
    }
    return false;
  }
  if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    return false;
  }
  if (field->containing_oneof() != NULL) {
    // Oneof fields will always be dependent.
    //
    // This is a unique case for field codegen. Field generators are
    // responsible for generating all the field-specific accessor
    // functions, except for the clear_*() function; instead, field
    // generators produce inline clearing code.
    //
    // For non-oneof fields, the Message class uses the inline clearing
    // code to define the field's clear_*() function, as well as in the
    // destructor. For oneof fields, the Message class generates a much
    // more complicated clear_*() function, which clears only the oneof
    // member that is set, in addition to clearing methods for each of the
    // oneof members individually.
    //
    // Since oneofs do not have their own generator class, the Message code
    // generation logic would be significantly complicated in order to
    // split dependent and non-dependent manipulation logic based on
    // whether the oneof truly needs to be dependent; so, for oneof fields,
    // we just assume it (and its constituents) should be manipulated by a
    // dependent base class function.
    //
    // This is less precise than how dependent message-typed fields are
    // handled, but the cost is limited to only the generated code for the
    // oneof field, which seems like an acceptable tradeoff.
    return true;
  }
  if (field->file() == field->message_type()->file()) {
    return false;
  }
  return true;
}